

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::InfoWriter::
WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
          (InfoWriter *this,char *key,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  ostream *poVar1;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)this,"set(");
  poVar1 = std::operator<<(poVar1,key);
  poVar1 = std::operator<<(poVar1," \"");
  ListJoin<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            (&sStack_38,
             (InfoWriter *)(container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&(container->_M_t)._M_impl.super__Rb_tree_header,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmQtAutoGenInitializer::InfoWriter::WriteStrings(const char* key,
                                                      C const& container)
{
  Ofs_ << "set(" << key << " \""
       << ListJoin(container.begin(), container.end()) << "\")\n";
}